

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void zsummer::log4z::ParseConfig
               (char *file,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
               *outInfo)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  long lVar6;
  iterator iVar7;
  ostream *poVar8;
  size_type sVar9;
  int iVar10;
  CLog4zFile f;
  string value;
  string key;
  string curLoggerName;
  string line;
  string tmpstr;
  LoggerInfo li;
  char buf [500];
  
  f.m_file = (FILE *)0x0;
  CLog4zFile::Open(&f,file,"r");
  if (f.m_file != (FILE *)0x0) {
    curLoggerName._M_dataplus._M_p = (pointer)&curLoggerName.field_2;
    curLoggerName._M_string_length = 0;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    iVar10 = 0;
    curLoggerName.field_2._M_local_buf[0] = '\0';
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    key.field_2._M_local_buf[0] = '\0';
    value.field_2._M_local_buf[0] = '\0';
    p_Var5 = &(outInfo->_M_t)._M_impl.super__Rb_tree_header;
LAB_00119e2c:
    memset(buf,0,500);
    bVar3 = CLog4zFile::ReadLine(&f,buf,499);
    if (bVar3) {
      std::__cxx11::string::assign((char *)&line);
      TrimLogConfig(&line,'\0');
      iVar10 = iVar10 + 1;
      if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
        if (*line._M_dataplus._M_p == '[') {
          TrimLogConfig(&line,'[');
          TrimLogConfig(&line,']');
          std::__cxx11::string::_M_assign((string *)&curLoggerName);
          std::__cxx11::string::string((string *)&tmpstr,(string *)&line);
          sVar2 = tmpstr._M_string_length;
          _Var1 = tmpstr._M_dataplus;
          for (sVar9 = 0; sVar2 != sVar9; sVar9 = sVar9 + 1) {
            iVar4 = tolower((int)_Var1._M_p[sVar9]);
            _Var1._M_p[sVar9] = (char)iVar4;
          }
          bVar3 = std::operator==(&tmpstr,"main");
          if (bVar3) {
            std::__cxx11::string::assign((char *)&curLoggerName);
          }
          std::__cxx11::string::~string((string *)&tmpstr);
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                  ::find(&outInfo->_M_t,&curLoggerName);
          if ((_Rb_tree_header *)iVar7._M_node == p_Var5) {
            LoggerInfo::LoggerInfo(&li);
            LoggerInfo::SetDefaultInfo(&li);
            std::__cxx11::string::_M_assign((string *)&li);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_zsummer::log4z::LoggerInfo_&,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
                        *)&tmpstr,&li._name,&li);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,zsummer::log4z::LoggerInfo>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zsummer::log4z::LoggerInfo>>>
                        *)outInfo,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
                        *)&tmpstr);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>
                     *)&tmpstr);
            LoggerInfo::~LoggerInfo(&li);
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "log4z configure warning: dumplicate logger name:[");
            poVar8 = std::operator<<(poVar8,(string *)&curLoggerName);
            poVar8 = std::operator<<(poVar8,"] at line:");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          goto LAB_00119e2c;
        }
        lVar6 = std::__cxx11::string::find((char)&line,0x3d);
        if (lVar6 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "log4z configure warning: unresolved line:[");
          poVar8 = std::operator<<(poVar8,(string *)&line);
          poVar8 = std::operator<<(poVar8,"] at line:");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        else {
          std::__cxx11::string::substr((ulong)&tmpstr,(ulong)&line);
          std::__cxx11::string::operator=((string *)&key,(string *)&tmpstr);
          std::__cxx11::string::~string((string *)&tmpstr);
          std::__cxx11::string::substr((ulong)&tmpstr,(ulong)&line);
          std::__cxx11::string::operator=((string *)&value,(string *)&tmpstr);
          std::__cxx11::string::~string((string *)&tmpstr);
          TrimLogConfig(&key,'\0');
          TrimLogConfig(&value,'\0');
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zsummer::log4z::LoggerInfo>_>_>
                  ::find(&outInfo->_M_t,&curLoggerName);
          sVar2 = key._M_string_length;
          _Var1 = key._M_dataplus;
          if ((_Rb_tree_header *)iVar7._M_node == p_Var5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "log4z configure warning: not found current logger name:[");
            poVar8 = std::operator<<(poVar8,(string *)&curLoggerName);
            poVar8 = std::operator<<(poVar8,"] at line:");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
            poVar8 = std::operator<<(poVar8,", key=");
            poVar8 = std::operator<<(poVar8,(string *)&key);
            poVar8 = std::operator<<(poVar8,", value=");
            poVar8 = std::operator<<(poVar8,(string *)&value);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          else {
            for (sVar9 = 0; sVar2 != sVar9; sVar9 = sVar9 + 1) {
              iVar4 = tolower((int)_Var1._M_p[sVar9]);
              _Var1._M_p[sVar9] = (char)iVar4;
            }
            bVar3 = std::operator==(&key,"path");
            sVar2 = value._M_string_length;
            _Var1 = value._M_dataplus;
            if (bVar3) {
              std::__cxx11::string::_M_assign((string *)(iVar7._M_node + 4));
              goto LAB_00119e2c;
            }
            for (sVar9 = 0; sVar2 != sVar9; sVar9 = sVar9 + 1) {
              iVar4 = tolower((int)_Var1._M_p[sVar9]);
              _Var1._M_p[sVar9] = (char)iVar4;
            }
            bVar3 = std::operator==(&key,"level");
            if (bVar3) {
              bVar3 = std::operator==(&value,"debug");
              if (!bVar3) {
                bVar3 = std::operator==(&value,"all");
                if (!bVar3) {
                  bVar3 = std::operator==(&value,"info");
                  if (bVar3) {
                    iVar7._M_node[5]._M_color = _S_black;
                    goto LAB_00119e2c;
                  }
                  bVar3 = std::operator==(&value,"warn");
                  if (!bVar3) {
                    bVar3 = std::operator==(&value,"warning");
                    if (!bVar3) {
                      bVar3 = std::operator==(&value,"error");
                      if (bVar3) {
                        iVar7._M_node[5]._M_color = 3;
                        goto LAB_00119e2c;
                      }
                      bVar3 = std::operator==(&value,"alarm");
                      if (!bVar3) {
                        bVar3 = std::operator==(&value,"fatal");
                        if (bVar3) {
                          iVar7._M_node[5]._M_color = 5;
                        }
                        goto LAB_00119e2c;
                      }
                    }
                  }
                  iVar7._M_node[5]._M_color = 2;
                  goto LAB_00119e2c;
                }
              }
              iVar7._M_node[5]._M_color = _S_red;
              goto LAB_00119e2c;
            }
            bVar3 = std::operator==(&key,"display");
            if (bVar3) {
              bVar3 = std::operator==(&value,"false");
              if (!bVar3) {
                bVar3 = std::operator==(&value,"0");
                if (!bVar3) {
                  iVar7._M_node[5].field_0x4 = 1;
                  goto LAB_00119e2c;
                }
              }
              iVar7._M_node[5].field_0x4 = 0;
              goto LAB_00119e2c;
            }
            bVar3 = std::operator==(&key,"monthdir");
            if (bVar3) {
              bVar3 = std::operator==(&value,"false");
              if (!bVar3) {
                bVar3 = std::operator==(&value,"0");
                if (!bVar3) {
                  iVar7._M_node[5].field_0x5 = 1;
                  goto LAB_00119e2c;
                }
              }
              iVar7._M_node[5].field_0x5 = 0;
              goto LAB_00119e2c;
            }
            bVar3 = std::operator==(&key,"limitsize");
            if (bVar3) {
              iVar4 = atoi(value._M_dataplus._M_p);
              *(int *)&iVar7._M_node[5]._M_parent = iVar4;
            }
          }
        }
      }
      goto LAB_00119e2c;
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&curLoggerName);
  }
  CLog4zFile::~CLog4zFile(&f);
  return;
}

Assistant:

static void ParseConfig(const char* file, std::map<std::string, LoggerInfo> & outInfo)
{
	//! read file content
	{
		CLog4zFile f;
		f.Open(file, "r");

		if (f.IsOpen())
		{
			std::string curLoggerName;
			int curLineNum = 0;
			char buf[500];
			std::string line;
			std::string key;
			std::string value;
			do
			{
				memset(buf, 0, 500);
				if (!f.ReadLine(buf, 500-1))
				{
					break;
				}
				line = buf;
				curLineNum++;
				TrimLogConfig(line);

				if (line.empty())
				{
					continue;
				}
				if (*(line.begin()) == '#')
				{
					continue;
				}
				if (*(line.begin()) == '[')
				{
					TrimLogConfig(line, '[');
					TrimLogConfig(line, ']');
					curLoggerName = line;
					{
						std::string tmpstr = line;
						std::transform(tmpstr.begin(), tmpstr.end(), tmpstr.begin(), ::tolower);
						if (tmpstr == "main")
						{
							curLoggerName = "Main";
						}
					}
					std::map<std::string, LoggerInfo>::iterator iter = outInfo.find(curLoggerName);
					if (iter == outInfo.end())
					{
						LoggerInfo li;
						li.SetDefaultInfo();
						li._name = curLoggerName;
						outInfo.insert(std::make_pair(li._name, li));
					}
					else
					{
						std::cout << "log4z configure warning: dumplicate logger name:["<< curLoggerName << "] at line:" << curLineNum << std::endl;
					}
					continue;
				}
				size_t pos = line.find_first_of('=');
				if (pos == std::string::npos)
				{
					std::cout << "log4z configure warning: unresolved line:["<< line << "] at line:" << curLineNum << std::endl;
					continue;
				}
				key = line.substr(0, pos);
				value = line.substr(pos+1);
				TrimLogConfig(key);
				TrimLogConfig(value);
				std::map<std::string, LoggerInfo>::iterator iter = outInfo.find(curLoggerName);
				if (iter == outInfo.end())
				{
					std::cout << "log4z configure warning: not found current logger name:["<< curLoggerName << "] at line:" << curLineNum
						<< ", key=" <<key << ", value=" << value << std::endl;
					continue;
				}
				std::transform(key.begin(), key.end(), key.begin(), ::tolower);
				//! path
				if (key == "path")
				{
					iter->second._path = value;
					continue;
				}
				std::transform(value.begin(), value.end(), value.begin(), ::tolower);
				//! level
				if (key == "level")
				{
					if (value == "debug" || value == "all")
					{
						iter->second._level = LOG_LEVEL_DEBUG;
					}
					else if (value == "info")
					{
						iter->second._level = LOG_LEVEL_INFO;
					}
					else if (value == "warn" || value == "warning")
					{
						iter->second._level = LOG_LEVEL_WARN;
					}
					else if (value == "error")
					{
						iter->second._level = LOG_LEVEL_ERROR;
					}
					else if (value == "alarm")
					{
						iter->second._level = LOG_LEVEL_WARN;
					}
					else if (value == "fatal")
					{
						iter->second._level = LOG_LEVEL_FATAL;
					}
				}
				//! display
				else if (key == "display")
				{
					if (value == "false" || value == "0")
					{
						iter->second._display = false;
					}
					else
					{
						iter->second._display = true;
					}
				}
				//! monthdir
				else if (key == "monthdir")
				{
					if (value == "false" || value == "0")
					{
						iter->second._monthdir = false;
					}
					else
					{
						iter->second._monthdir = true;
					}
				}
				//! limit file size
				else if (key == "limitsize")
				{
					iter->second._limitsize = atoi(value.c_str());
				}

			} while (1);
		}
	}
}